

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# darLib.c
# Opt level: O0

void Dar_LibPrepare(int nSubgraphs)

{
  Dar_Lib_t *p_00;
  int iVar1;
  Dar_LibObj_t *pDVar2;
  int local_24;
  int local_20;
  int nNodes0Total;
  int k;
  int i;
  Dar_Lib_t *p;
  int nSubgraphs_local;
  
  p_00 = s_DarLib;
  if (s_DarLib->nSubgraphs != nSubgraphs) {
    s_DarLib->nSubgr0Total = 0;
    for (nNodes0Total = 0; nNodes0Total < 0xde; nNodes0Total = nNodes0Total + 1) {
      if (nNodes0Total == 1) {
        p_00->nSubgr0[1] = p_00->nSubgr[1];
      }
      else {
        iVar1 = Abc_MinInt(p_00->nSubgr[nNodes0Total],nSubgraphs);
        p_00->nSubgr0[nNodes0Total] = iVar1;
      }
      p_00->nSubgr0Total = p_00->nSubgr0[nNodes0Total] + p_00->nSubgr0Total;
      for (local_20 = 0; local_20 < p_00->nSubgr0[nNodes0Total]; local_20 = local_20 + 1) {
        p_00->pSubgr0[nNodes0Total][local_20] =
             p_00->pSubgr[nNodes0Total][p_00->pPrios[nNodes0Total][local_20]];
      }
    }
    for (nNodes0Total = 0; nNodes0Total < 0xde; nNodes0Total = nNodes0Total + 1) {
      p_00->nNodes0[nNodes0Total] = 0;
    }
    for (nNodes0Total = 0; nNodes0Total < p_00->iObj; nNodes0Total = nNodes0Total + 1) {
      pDVar2 = Dar_LibObj(p_00,nNodes0Total);
      *pDVar2 = (Dar_LibObj_t)((ulong)*pDVar2 & 0xfffffffff | 0xff000000000);
    }
    p_00->nNodes0Total = 0;
    p_00->nNodes0Max = 0;
    for (nNodes0Total = 0; nNodes0Total < 0xde; nNodes0Total = nNodes0Total + 1) {
      for (local_20 = 0; local_20 < p_00->nSubgr0[nNodes0Total]; local_20 = local_20 + 1) {
        pDVar2 = Dar_LibObj(p_00,p_00->pSubgr0[nNodes0Total][local_20]);
        Dar_LibSetup0_rec(p_00,pDVar2,nNodes0Total,0);
      }
      p_00->nNodes0Total = p_00->nNodes0[nNodes0Total] + p_00->nNodes0Total;
      iVar1 = Abc_MaxInt(p_00->nNodes0Max,p_00->nNodes0[nNodes0Total]);
      p_00->nNodes0Max = iVar1;
    }
    for (nNodes0Total = 0; nNodes0Total < 0xde; nNodes0Total = nNodes0Total + 1) {
      p_00->nNodes0[nNodes0Total] = 0;
    }
    for (nNodes0Total = 0; nNodes0Total < p_00->iObj; nNodes0Total = nNodes0Total + 1) {
      pDVar2 = Dar_LibObj(p_00,nNodes0Total);
      *pDVar2 = (Dar_LibObj_t)((ulong)*pDVar2 & 0xfffffffff | 0xff000000000);
    }
    local_24 = 0;
    for (nNodes0Total = 0; nNodes0Total < 0xde; nNodes0Total = nNodes0Total + 1) {
      for (local_20 = 0; local_20 < p_00->nSubgr0[nNodes0Total]; local_20 = local_20 + 1) {
        pDVar2 = Dar_LibObj(p_00,p_00->pSubgr0[nNodes0Total][local_20]);
        Dar_LibSetup0_rec(p_00,pDVar2,nNodes0Total,1);
      }
      local_24 = p_00->nNodes0[nNodes0Total] + local_24;
    }
    if (local_24 != p_00->nNodes0Total) {
      __assert_fail("nNodes0Total == p->nNodes0Total",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/opt/dar/darLib.c"
                    ,0x21a,"void Dar_LibPrepare(int)");
    }
    for (nNodes0Total = 0; nNodes0Total < 4; nNodes0Total = nNodes0Total + 1) {
      pDVar2 = Dar_LibObj(p_00,nNodes0Total);
      *pDVar2 = (Dar_LibObj_t)((ulong)*pDVar2 & 0xfffffffff | (ulong)(uint)nNodes0Total << 0x24);
    }
    Dar_LibCreateData(p_00,p_00->nNodes0Max + 0x20);
  }
  return;
}

Assistant:

void Dar_LibPrepare( int nSubgraphs )
{
    Dar_Lib_t * p = s_DarLib;
    int i, k, nNodes0Total;
    if ( p->nSubgraphs == nSubgraphs )
        return;

    // favor special classes:
    //  1 : F = (!d*!c*!b*!a)
    //  4 : F = (!d*!c*!(b*a))
    // 12 : F = (!d*!(c*!(!b*!a)))
    // 20 : F = (!d*!(c*b*a))

    // set the subgraph counters 
    p->nSubgr0Total = 0;
    for ( i = 0; i < 222; i++ )
    {
//        if ( i == 1 || i == 4 || i == 12 || i == 20 ) // special classes 
        if ( i == 1 ) // special classes 
            p->nSubgr0[i] = p->nSubgr[i];
        else
            p->nSubgr0[i] = Abc_MinInt( p->nSubgr[i], nSubgraphs );
        p->nSubgr0Total += p->nSubgr0[i];
        for ( k = 0; k < p->nSubgr0[i]; k++ )
            p->pSubgr0[i][k] = p->pSubgr[i][ p->pPrios[i][k] ];
    }

    // count the number of nodes
    // clean node counters
    for ( i = 0; i < 222; i++ )
        p->nNodes0[i] = 0;
    // create traversal IDs
    for ( i = 0; i < p->iObj; i++ )
        Dar_LibObj(p, i)->Num = 0xff;
    // count nodes in each class
    // count the total number of nodes and the largest class
    p->nNodes0Total = 0;
    p->nNodes0Max = 0;
    for ( i = 0; i < 222; i++ )
    {
        for ( k = 0; k < p->nSubgr0[i]; k++ )
            Dar_LibSetup0_rec( p, Dar_LibObj(p, p->pSubgr0[i][k]), i, 0 );
        p->nNodes0Total += p->nNodes0[i];
        p->nNodes0Max = Abc_MaxInt( p->nNodes0Max, p->nNodes0[i] );
    }

    // clean node counters
    for ( i = 0; i < 222; i++ )
        p->nNodes0[i] = 0;
    // create traversal IDs
    for ( i = 0; i < p->iObj; i++ )
        Dar_LibObj(p, i)->Num = 0xff;
    // add the nodes to storage
    nNodes0Total = 0;
    for ( i = 0; i < 222; i++ )
    {
        for ( k = 0; k < p->nSubgr0[i]; k++ )
            Dar_LibSetup0_rec( p, Dar_LibObj(p, p->pSubgr0[i][k]), i, 1 );
         nNodes0Total += p->nNodes0[i];
    }
    assert( nNodes0Total == p->nNodes0Total );
     // prepare the number of the PI nodes
    for ( i = 0; i < 4; i++ )
        Dar_LibObj(p, i)->Num = i;

    // realloc the datas
    Dar_LibCreateData( p, p->nNodes0Max + 32 ); 
    // allocated more because Dar_LibBuildBest() sometimes requires more entries
}